

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * ghc::filesystem::canonical(path *__return_storage_ptr__,path *p,error_code *ec)

{
  error_code *peVar1;
  size_type sVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  bool bVar5;
  bool bVar6;
  error_category *peVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  size_type *psVar9;
  path local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  path *local_170;
  error_code *local_168;
  size_type *local_160;
  size_type local_158;
  file_status sls;
  file_status fs;
  path work;
  string local_120 [32];
  path target;
  path pe;
  iterator __begin3;
  iterator __end3;
  
  if ((p->_path)._M_string_length == 0) {
    peVar7 = (error_category *)std::_V2::system_category();
    ec->_M_value = 2;
    ec->_M_cat = peVar7;
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  bVar5 = path::has_root_directory(p);
  if (bVar5) {
    std::__cxx11::string::string((string *)&work,(string *)p);
  }
  else {
    absolute(&work,p,ec);
  }
  local_198._path._M_dataplus._M_p = (pointer)&local_198._path.field_2;
  local_198._path._M_string_length = 0;
  local_198._path.field_2._M_local_buf[0] = '\0';
  status((filesystem *)&fs,&work,ec);
  psVar9 = &(__return_storage_ptr__->_path)._M_string_length;
  if (ec->_M_value == 0) {
    if (fs._type != not_found) {
      local_178 = &(__return_storage_ptr__->_path).field_2;
      local_170 = __return_storage_ptr__;
      local_168 = ec;
      local_160 = psVar9;
      do {
        local_158 = path::root_name_length(&work);
        bVar5 = path::has_root_directory(&work);
        local_198._path._M_string_length = 0;
        *local_198._path._M_dataplus._M_p = '\0';
        path::begin(&__begin3,&work);
        path::end(&__end3,&work);
        local_158 = local_158 + bVar5;
        bVar5 = false;
        while (cVar4._M_current = __end3._iter._M_current,
              cVar3._M_current = __begin3._iter._M_current,
              __begin3._iter._M_current != __end3._iter._M_current) {
          std::__cxx11::string::string((string *)&pe,(string *)&__begin3._current);
          if (pe._path._M_string_length == 0) {
LAB_0011a748:
            std::__cxx11::string::~string((string *)&pe);
          }
          else {
            path::path<char[2],ghc::filesystem::path>(&target,(char (*) [2])0x13b051,auto_format);
            bVar6 = operator==(&pe,&target);
            std::__cxx11::string::~string((string *)&target);
            if (bVar6) goto LAB_0011a748;
            path::path<char[3],ghc::filesystem::path>(&target,(char (*) [3])"..",auto_format);
            bVar6 = operator==(&pe,&target);
            std::__cxx11::string::~string((string *)&target);
            if (bVar6) {
              path::parent_path(&target,&local_198);
              std::__cxx11::string::operator=((string *)&local_198,(string *)&target);
              std::__cxx11::string::~string((string *)&target);
              goto LAB_0011a748;
            }
            operator/((path *)local_120,&local_198,&pe);
            std::__cxx11::string::string((string *)&target,local_120);
            sVar2 = target._path._M_string_length;
            std::__cxx11::string::~string((string *)&target);
            std::__cxx11::string::~string(local_120);
            if (sVar2 <= local_158) {
              path::operator/=(&local_198,&pe);
              goto LAB_0011a748;
            }
            operator/(&target,&local_198,&pe);
            peVar1 = local_168;
            symlink_status((filesystem *)&sls,&target,local_168);
            std::__cxx11::string::~string((string *)&target);
            if (peVar1->_M_value != 0) {
              (local_170->_path)._M_dataplus._M_p = (pointer)local_178;
              (local_170->_path)._M_string_length = 0;
              (local_170->_path).field_2._M_local_buf[0] = '\0';
              std::__cxx11::string::~string((string *)&pe);
              break;
            }
            if (sls._type != symlink) {
              path::operator/=(&local_198,&pe);
              goto LAB_0011a748;
            }
            operator/((path *)local_120,&local_198,&pe);
            peVar1 = local_168;
            read_symlink(&target,(path *)local_120,local_168);
            std::__cxx11::string::~string(local_120);
            if (peVar1->_M_value != 0) {
              (local_170->_path)._M_dataplus._M_p = (pointer)local_178;
              (local_170->_path)._M_string_length = 0;
              (local_170->_path).field_2._M_local_buf[0] = '\0';
              std::__cxx11::string::~string((string *)&target);
              std::__cxx11::string::~string((string *)&pe);
              bVar5 = true;
              break;
            }
            bVar5 = path::has_root_directory(&target);
            if (bVar5) {
              std::__cxx11::string::_M_assign((string *)&local_198);
            }
            else {
              path::operator/=(&local_198,&target);
            }
            std::__cxx11::string::~string((string *)&target);
            std::__cxx11::string::~string((string *)&pe);
            bVar5 = true;
          }
          path::iterator::operator++(&__begin3);
        }
        std::__cxx11::string::~string((string *)&__end3._current);
        std::__cxx11::string::~string((string *)&__begin3._current);
        __return_storage_ptr__ = local_170;
        if (cVar3._M_current != cVar4._M_current) goto LAB_0011a4e5;
        std::__cxx11::string::_M_assign((string *)&work);
      } while (bVar5);
      std::error_code::clear(local_168);
      (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)local_178;
      paVar8 = &local_198._path.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._path._M_dataplus._M_p == paVar8) {
        local_178->_M_allocated_capacity =
             CONCAT71(local_198._path.field_2._M_allocated_capacity._1_7_,
                      local_198._path.field_2._M_local_buf[0]);
        *(undefined8 *)((long)local_178 + 8) = local_198._path.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_path)._M_dataplus._M_p = local_198._path._M_dataplus._M_p;
        (__return_storage_ptr__->_path).field_2._M_allocated_capacity =
             CONCAT71(local_198._path.field_2._M_allocated_capacity._1_7_,
                      local_198._path.field_2._M_local_buf[0]);
      }
      psVar9 = &local_198._path._M_string_length;
      *local_160 = local_198._path._M_string_length;
      local_198._path._M_dataplus._M_p = (pointer)paVar8;
      goto LAB_0011a4de;
    }
    peVar7 = (error_category *)std::_V2::system_category();
    ec->_M_value = 2;
    ec->_M_cat = peVar7;
  }
  paVar8 = &(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar8;
LAB_0011a4de:
  *psVar9 = 0;
  paVar8->_M_local_buf[0] = '\0';
LAB_0011a4e5:
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&work);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path canonical(const path& p, std::error_code& ec)
{
    if (p.empty()) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    path work = p.is_absolute() ? p : absolute(p, ec);
    path result;

    auto fs = status(work, ec);
    if (ec) {
        return path();
    }
    if (fs.type() == file_type::not_found) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    bool redo;
    do {
        auto rootPathLen = work._prefixLength + work.root_name_length() + (work.has_root_directory() ? 1 : 0);
        redo = false;
        result.clear();
        for (auto pe : work) {
            if (pe.empty() || pe == ".") {
                continue;
            }
            else if (pe == "..") {
                result = result.parent_path();
                continue;
            }
            else if ((result / pe).string().length() <= rootPathLen) {
                result /= pe;
                continue;
            }
            auto sls = symlink_status(result / pe, ec);
            if (ec) {
                return path();
            }
            if (is_symlink(sls)) {
                redo = true;
                auto target = read_symlink(result / pe, ec);
                if (ec) {
                    return path();
                }
                if (target.is_absolute()) {
                    result = target;
                    continue;
                }
                else {
                    result /= target;
                    continue;
                }
            }
            else {
                result /= pe;
            }
        }
        work = result;
    } while (redo);
    ec.clear();
    return result;
}